

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf_v3::load_s_desc(xr_ogf_v3 *this,xr_reader *r)

{
  uint32_t uVar1;
  xr_reader *r_local;
  xr_ogf_v3 *this_local;
  
  xr_reader::r_sz(r,&this->m_source);
  xr_reader::r_sz(r,&this->m_export_tool);
  uVar1 = xr_reader::r_u32(r);
  this->m_export_time = uVar1;
  xr_reader::r_sz(r,&(this->super_xr_ogf).super_xr_object.m_owner_name);
  uVar1 = xr_reader::r_u32(r);
  (this->super_xr_ogf).super_xr_object.m_creation_time = uVar1;
  xr_reader::r_sz(r,&(this->super_xr_ogf).super_xr_object.m_modif_name);
  uVar1 = xr_reader::r_u32(r);
  (this->super_xr_ogf).super_xr_object.m_modified_time = uVar1;
  xr_ogf::set_chunk_loaded(&this->super_xr_ogf,0x1b);
  return;
}

Assistant:

inline void xr_ogf_v3::load_s_desc(xr_reader& r)
{
	r.r_sz(m_source);
	r.r_sz(m_export_tool);
	m_export_time = r.r_u32();
	r.r_sz(m_owner_name);
	m_creation_time = r.r_u32();
	r.r_sz(m_modif_name);
	m_modified_time = r.r_u32();
	set_chunk_loaded(OGF3_S_DESC);
}